

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManTransformDualOutput(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  Gia_Man_t *pGVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  Vec_Int_t *__ptr;
  
  pVVar9 = Gia_ManCollectOneSide(p,0);
  pVVar10 = Gia_ManCollectOneSide(p,1);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc05,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  if ((p->vCos->nSize & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc06,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  iVar2 = pVVar9->nSize;
  iVar1 = pVVar10->nSize;
  __ptr = pVVar9;
  if (iVar1 < iVar2) {
    __ptr = pVVar10;
    pVVar10 = pVVar9;
  }
  if (pVVar10->nSize < __ptr->nSize) {
    __assert_fail("Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xc0c,"Gia_Man_t *Gia_ManTransformDualOutput(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar5);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar5);
  }
  p_00->pName = pcVar12;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar5);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar5);
  }
  p_00->pSpec = pcVar12;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar9->pArray[lVar18];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ebe9f;
      pGVar6 = p->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar14 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar14 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar14 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) {
LAB_001ebedd:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) goto LAB_001ebedd;
      pGVar6[iVar3].Value = (int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar9 = p->vCis;
    } while (lVar18 < pVVar9->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar18 = 0;
    do {
      iVar3 = __ptr->pArray[lVar18];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ebe9f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = p->pObjs + iVar3;
      uVar14 = *(ulong *)pGVar6;
      if ((int)pGVar6[-(ulong)((uint)uVar14 & 0x1fffffff)].Value < 0) goto LAB_001ebebe;
      uVar8 = (uint)(uVar14 >> 0x20);
      if ((int)pGVar6[-(ulong)(uVar8 & 0x1fffffff)].Value < 0) goto LAB_001ebebe;
      uVar8 = Gia_ManHashAnd(p_00,(uint)(uVar14 >> 0x1d) & 1 ^
                                  pGVar6[-(ulong)((uint)uVar14 & 0x1fffffff)].Value,
                             pGVar6[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1);
      pGVar6->Value = uVar8;
      lVar18 = lVar18 + 1;
    } while (lVar18 < __ptr->nSize);
  }
  if (0 < pVVar10->nSize) {
    lVar18 = 0;
    do {
      iVar3 = pVVar10->pArray[lVar18];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_001ebe9f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = p->pObjs + iVar3;
      uVar14 = *(ulong *)pGVar6;
      if ((int)pGVar6[-(ulong)((uint)uVar14 & 0x1fffffff)].Value < 0) goto LAB_001ebebe;
      uVar8 = (uint)(uVar14 >> 0x20);
      if ((int)pGVar6[-(ulong)(uVar8 & 0x1fffffff)].Value < 0) goto LAB_001ebebe;
      uVar8 = Gia_ManHashAnd(p_00,(uint)(uVar14 >> 0x1d) & 1 ^
                                  pGVar6[-(ulong)((uint)uVar14 & 0x1fffffff)].Value,
                             pGVar6[-(ulong)(uVar8 & 0x1fffffff)].Value ^ uVar8 >> 0x1d & 1);
      pGVar6->Value = uVar8;
      lVar18 = lVar18 + 1;
    } while (lVar18 < pVVar10->nSize);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  if (pVVar10->pArray != (int *)0x0) {
    free(pVVar10->pArray);
    pVVar10->pArray = (int *)0x0;
  }
  if (pVVar10 != (Vec_Int_t *)0x0) {
    free(pVVar10);
  }
  pVVar10 = p->vCos;
  uVar8 = pVVar10->nSize;
  uVar14 = (ulong)uVar8;
  uVar16 = uVar8 - p->nRegs;
  uVar17 = (ulong)uVar16;
  if (uVar16 != 0 && p->nRegs <= (int)uVar8) {
    lVar18 = 0;
LAB_001ebda1:
    if ((int)uVar14 <= lVar18) {
LAB_001ebefc:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = pVVar10->pArray[lVar18];
    if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_001ebe9f:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar6 = p->pObjs;
    if (pGVar6 != (Gia_Obj_t *)0x0) {
      uVar8 = (uint)lVar18 ^ (uint)(iVar1 < iVar2);
      if ((int)uVar17 <= (int)uVar8) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if ((int)uVar14 <= (int)uVar8) goto LAB_001ebefc;
      iVar4 = pVVar10->pArray[uVar8];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_001ebe9f;
      uVar16 = (uint)*(undefined8 *)(pGVar6 + iVar4);
      uVar8 = (pGVar6 + iVar4)[-(ulong)(uVar16 & 0x1fffffff)].Value;
      if ((int)uVar8 < 0) {
LAB_001ebebe:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar8 = Gia_ManAppendCo(p_00,uVar16 >> 0x1d & 1 ^ uVar8);
      pGVar6[iVar3].Value = uVar8;
      lVar18 = lVar18 + 1;
      pVVar10 = p->vCos;
      uVar14 = (ulong)pVVar10->nSize;
      uVar17 = uVar14 - (long)p->nRegs;
      if (lVar18 < (long)uVar17) goto LAB_001ebda1;
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar15 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar15;
}

Assistant:

Gia_Man_t * Gia_ManTransformDualOutput( Gia_Man_t * p )
{
    Vec_Int_t * vNodes0 = Gia_ManCollectOneSide( p, 0 );
    Vec_Int_t * vNodes1 = Gia_ManCollectOneSide( p, 1 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, fSwap = 0;
    assert( Gia_ManRegNum(p) == 0 );
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    if ( Vec_IntSize(vNodes0) > Vec_IntSize(vNodes1) )
    {
        ABC_SWAP( Vec_Int_t *, vNodes0, vNodes1 );
        fSwap = 1;
    }
    assert( Vec_IntSize(vNodes0) <= Vec_IntSize(vNodes1) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachObjVec( vNodes0, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachObjVec( vNodes1, p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Vec_IntFree( vNodes0 );
    Vec_IntFree( vNodes1 );
    Gia_ManForEachPo( p, pObj, i )
    {
        pObj2 = Gia_ManPo( p, i^fSwap );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}